

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall vmrun_prop_eval::get_prop(vmrun_prop_eval *this)

{
  uint uVar1;
  int iVar2;
  vm_val_t *pvVar3;
  uchar *puVar4;
  uint *in_RDI;
  vmrun_prop_eval *in_stack_00000008;
  vm_prop_id_t real_target_prop;
  uchar *local_8;
  
  iVar2 = get_prop_no_eval(in_stack_00000008);
  if (iVar2 == 0) {
    if (G_predef_X.prop_not_defined_prop != 0) {
      uVar1 = in_RDI[1];
      *(vm_prop_id_t *)(in_RDI + 1) = G_predef_X.prop_not_defined_prop;
      iVar2 = get_prop_no_eval(in_stack_00000008);
      if (iVar2 != 0) {
        if (((in_RDI[8] == 0xb) || (in_RDI[8] == 0x11)) || (in_RDI[8] == 0x12)) {
          pvVar3 = CVmStack::push();
          vm_val_t::set_propid(pvVar3,(vm_prop_id_t)uVar1);
          in_RDI[6] = in_RDI[6] + 1;
        }
        puVar4 = eval_prop_val(in_stack_00000008);
        return puVar4;
      }
    }
    CVmStack::discard(in_RDI[6]);
    pvVar3 = CVmRun::get_r0();
    vm_val_t::set_nil(pvVar3);
    local_8 = CVmRun::get_entry_ptr();
    local_8 = local_8 + *in_RDI;
  }
  else {
    local_8 = eval_prop_val(in_stack_00000008);
  }
  return local_8;
}

Assistant:

const uchar *get_prop(VMG0_)
    {
        /* find the property without evaluating it */
        if (get_prop_no_eval(vmg0_))
            return eval_prop_val(vmg0_);

        /* try propNotDefined */
        if (G_predef->prop_not_defined_prop != VM_INVALID_PROP)
        {
            /* save the original target property */
            vm_prop_id_t real_target_prop = target_prop;
            
            /* look up propNotDefined */
            target_prop = G_predef->prop_not_defined_prop;
            if (get_prop_no_eval(vmg0_))
            {
                /* if we found a method, set up to call it */
                if (val.typ == VM_CODEOFS
                    || val.typ == VM_OBJX
                    || val.typ == VM_BIFPTRX)
                {
                    /* 
                     *   add the target property as the additional first
                     *   argument to propNotDefined (we push backwards, so
                     *   this will conveniently become the new first
                     *   argument) 
                     */
                    G_stk->push()->set_propid(real_target_prop);
                    
                    /* count the additional argument */
                    ++argc;
                }
                
                return eval_prop_val(vmg0_);
            }
        }
            
        /* 
         *   the property or method is not defined - discard arguments and
         *   set R0 to nil 
         */
        G_stk->discard(argc);
        G_interpreter->get_r0()->set_nil();

        /* resume execution where we left off */
        return G_interpreter->get_entry_ptr() + caller_ofs;
    }